

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O2

bool __thiscall IntView<2>::indomain(IntView<2> *this,int64_t v)

{
  bool bVar1;
  
  if (v % (long)this->a != 0) {
    return false;
  }
  bVar1 = IntVar::indomain(this->var,v / (long)this->a);
  return bVar1;
}

Assistant:

bool indomain(int64_t v) const {
		if ((type & 4) != 0) {
			v -= b;
		}
		if ((type & 2) != 0) {
			if ((v % a) != 0) {
				return false;
			}
			v = v / a;
		}
		if ((type & 1) != 0) {
			v = -v;
		}
		return var->indomain(v);
	}